

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
sciplot::internal::escapeIfNeeded<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,internal *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  std::operator+(&bStack_38,"\"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::operator+(__return_storage_ptr__,&bStack_38,"\"");
  std::__cxx11::string::~string((string *)&bStack_38);
  return __return_storage_ptr__;
}

Assistant:

auto escapeIfNeeded(const T& val)
{
    if constexpr (isString<T>)
        return "\"" + val + "\"";
    else return val;
}